

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void * tc_memalign(size_t align,size_t size)

{
  void *p;
  size_t local_38;
  memalign_retry_data data;
  
  p = do_debug_memalign(align,size,-0x10325470);
  if (p == (void *)0x0) {
    data.size._0_4_ = 0xefcdab90;
    local_38 = align;
    data.align = size;
    p = anon_unknown.dwarf_5263::handle_oom(retry_debug_memalign,&local_38,false,true);
  }
  tcmalloc::InvokeNewHook(p,size);
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_memalign(size_t align, size_t size) PERFTOOLS_NOTHROW {
  void *p = do_debug_memalign_or_debug_cpp_memalign(align, size, MallocBlock::kMallocType, false, true);
  tcmalloc::InvokeNewHook(p, size);
  return p;
}